

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

RIP * __thiscall ASDCP::MXF::RIP::WriteToFile(RIP *this,FileWriter *Writer)

{
  int iVar1;
  byte bVar2;
  MDDEntry *pMVar3;
  uint uVar4;
  uint in_EDX;
  FileWriter *pFVar5;
  FrameBuffer Buffer;
  MemIOWriter MemWRT;
  FrameBuffer local_e0;
  MemIOWriter local_b8 [6];
  undefined **local_50;
  undefined1 local_48;
  undefined4 local_47;
  undefined4 uStack_43;
  undefined4 uStack_3f;
  undefined4 uStack_3b;
  
  if (*(long *)(Writer + 0x70) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x93,"virtual ASDCP::Result_t ASDCP::MXF::RIP::WriteToFile(Kumu::FileWriter &)");
  }
  FrameBuffer::FrameBuffer(&local_e0);
  iVar1 = *(int *)(Writer + 0x90);
  FrameBuffer::Capacity((FrameBuffer *)this,(ui32_t)&local_e0);
  if (*(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket < 0) goto LAB_001a3a50;
  pMVar3 = Dictionary::Type(*(Dictionary **)(Writer + 0x70),MDD_RandomIndexMetadata);
  local_48 = 1;
  local_47 = *(undefined4 *)pMVar3->ul;
  uStack_43 = *(undefined4 *)(pMVar3->ul + 4);
  uStack_3f = *(undefined4 *)(pMVar3->ul + 8);
  uStack_3b = *(undefined4 *)(pMVar3->ul + 0xc);
  local_50 = &PTR__IArchive_0021d318;
  (**(code **)(*(long *)Writer + 0x60))(local_b8,Writer);
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b8);
  Kumu::Result_t::~Result_t((Result_t *)local_b8);
  if (*(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket < 0) goto LAB_001a3a50;
  local_50 = (undefined **)CONCAT44(local_50._4_4_,0x9d);
  Kumu::Result_t::operator()((int *)local_b8,ASDCP::RESULT_KLV_CODING);
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b8);
  Kumu::Result_t::~Result_t((Result_t *)local_b8);
  Kumu::MemIOWriter::MemIOWriter(local_b8,local_e0.m_Data,local_e0.m_Capacity);
  pFVar5 = *(FileWriter **)(Writer + 0x80);
  if (pFVar5 == Writer + 0x80) {
LAB_001a39da:
    if ((ulong)local_b8[0].m_size + 4 <= (ulong)local_b8[0].m_capacity) {
      uVar4 = iVar1 * 0xc + 0x18;
      *(uint *)(local_b8[0].m_p + local_b8[0].m_size) =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
      local_e0.m_Size = local_b8[0].m_size + 4;
      local_b8[0].m_size = local_e0.m_Size;
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
    }
  }
  else {
    do {
      bVar2 = (**(code **)(*(long *)(pFVar5 + 0x10) + 0x20))(pFVar5 + 0x10,local_b8);
      pFVar5 = *(FileWriter **)pFVar5;
    } while ((bVar2 & pFVar5 != Writer + 0x80) != 0);
    if (bVar2 != 0) goto LAB_001a39da;
  }
  if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
    Kumu::FileWriter::Write((uchar *)local_b8,in_EDX,(uint *)local_e0.m_Data);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b8);
    Kumu::Result_t::~Result_t((Result_t *)local_b8);
  }
LAB_001a3a50:
  FrameBuffer::~FrameBuffer(&local_e0);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::RIP::WriteToFile(Kumu::FileWriter& Writer)
{
  assert(m_Dict);
  ASDCP::FrameBuffer Buffer;
  ui32_t RIPSize = ( PairArray.size() * (sizeof(ui32_t) + sizeof(ui64_t)) ) + 4;
  Result_t result = Buffer.Capacity(RIPSize);

  if ( ASDCP_SUCCESS(result) )
    result = WriteKLToFile(Writer, m_Dict->ul(MDD_RandomIndexMetadata), RIPSize);

  if ( ASDCP_SUCCESS(result) )
    {
      result = RESULT_KLV_CODING(__LINE__, __FILE__);

      Kumu::MemIOWriter MemWRT(Buffer.Data(), Buffer.Capacity());
      if ( PairArray.Archive(&MemWRT) )
	if ( MemWRT.WriteUi32BE(RIPSize + 20) )
	  {
	    Buffer.Size(MemWRT.Length());
	    result = RESULT_OK;
	  }
    }

  if ( ASDCP_SUCCESS(result) )
    result = Writer.Write(Buffer.RoData(), Buffer.Size());

  return result;
}